

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBoxPrivate::editingFinished(QComboBoxPrivate *this)

{
  QComboBox *this_00;
  QAbstractItemView *this_01;
  QComboBox *this_02;
  bool bVar1;
  MatchFlags flags;
  int index;
  QCompleter *pQVar2;
  QItemSelectionModel *pQVar3;
  long in_FS_OFFSET;
  QModelIndex local_90;
  Data *local_78;
  char16_t *pcStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->lineEdit == (QLineEdit *)0x0) goto LAB_003b17e7;
  this_00 = *(QComboBox **)&(this->super_QWidgetPrivate).field_0x8;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::text((QString *)&local_58,this->lineEdit);
  if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_90,&this->currentIndex);
    itemText((QString *)&local_78,this,&local_90);
    bVar1 = ::operator!=((QString *)&local_78,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    if (bVar1) {
      pQVar2 = QLineEdit::completer(this->lineEdit);
      if (((pQVar2 != (QCompleter *)0x0) &&
          (this_01 = *(QAbstractItemView **)(*(long *)&pQVar2->field_0x8 + 0x90),
          this_01 != (QAbstractItemView *)0x0)) &&
         ((*(byte *)(*(long *)(this_01 + 0x20) + 9) & 0x80) != 0)) {
        pQVar3 = QAbstractItemView::selectionModel(this_01);
        local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        pcStack_70 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QAbstractItemView::currentIndex((QModelIndex *)&local_78,this_01);
        if (pQVar3 != (QItemSelectionModel *)0x0) {
          QItemSelectionModel::selectedIndexes();
          bVar1 = QListSpecialMethodsBase<QModelIndex>::contains<QModelIndex>
                            ((QListSpecialMethodsBase<QModelIndex> *)&local_90,
                             (QModelIndex *)&local_78);
          QArrayDataPointer<QModelIndex>::~QArrayDataPointer
                    ((QArrayDataPointer<QModelIndex> *)&local_90);
          if (bVar1) goto LAB_003b17dd;
        }
      }
      this_02 = *(QComboBox **)&(this->super_QWidgetPrivate).field_0x8;
      flags = matchFlags(this);
      index = QComboBox::findText(this_02,(QString *)&local_58,flags);
      if (index != -1) {
        QComboBox::setCurrentIndex(this_00,index);
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QModelIndex *)&local_78,&this->currentIndex);
        emitActivated(this,(QModelIndex *)&local_78);
      }
    }
  }
LAB_003b17dd:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_003b17e7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::editingFinished()
{
    Q_Q(QComboBox);
    if (!lineEdit)
        return;
    const auto leText = lineEdit->text();
    if (!leText.isEmpty() && itemText(currentIndex) != leText) {
#if QT_CONFIG(completer)
        const auto *leCompleter = lineEdit->completer();
        const auto *popup = leCompleter ? QCompleterPrivate::get(leCompleter)->popup : nullptr;
        if (popup && popup->isVisible()) {
            // QLineEdit::editingFinished() will be emitted before the code flow returns
            // to QCompleter::eventFilter(), where QCompleter::activated() may be emitted.
            // We know that the completer popup will still be visible at this point, and
            // that any selection should be valid.
            const QItemSelectionModel *selModel = popup->selectionModel();
            const QModelIndex curIndex = popup->currentIndex();
            const bool completerIsActive = selModel && selModel->selectedIndexes().contains(curIndex);

            if (completerIsActive)
                return;
        }
#endif
        const int index = q_func()->findText(leText, matchFlags());
        if (index != -1) {
            q->setCurrentIndex(index);
            emitActivated(currentIndex);
        }
    }

}